

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMCDATASectionImpl.cpp
# Opt level: O3

XMLCh * __thiscall xercesc_4_0::DOMCDATASectionImpl::getWholeText(DOMCDATASectionImpl *this)

{
  int iVar1;
  undefined4 extraout_var;
  DOMCDATASectionImpl *pDVar3;
  long *plVar4;
  long *plVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  XMLCh *pXVar6;
  DOMException *this_00;
  undefined4 extraout_var_03;
  undefined8 *puVar7;
  undefined4 extraout_var_04;
  XMLBuffer buff;
  XMLBuffer local_58;
  long *plVar2;
  
  iVar1 = (*(this->super_DOMCDATASection).super_DOMText.super_DOMCharacterData.super_DOMNode.
            _vptr_DOMNode[0xc])();
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  if (plVar2 == (long *)0x0) {
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    iVar1 = (*(this->super_DOMCDATASection).super_DOMText.super_DOMCharacterData.super_DOMNode.
              _vptr_DOMNode[0xc])(this);
    if (CONCAT44(extraout_var_03,iVar1) == 0) {
      puVar7 = &XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar1 = (*(this->super_DOMCDATASection).super_DOMText.super_DOMCharacterData.super_DOMNode.
                _vptr_DOMNode[0xc])(this);
      puVar7 = (undefined8 *)(CONCAT44(extraout_var_04,iVar1) + 0x158);
    }
    DOMException::DOMException(this_00,9,0,(MemoryManager *)*puVar7);
    __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
  }
  pDVar3 = (DOMCDATASectionImpl *)(**(code **)(*plVar2 + 0x68))(plVar2);
  if (pDVar3 == (DOMCDATASectionImpl *)0x0) {
    pDVar3 = this;
  }
  plVar4 = (long *)(**(code **)(plVar2[2] + 0x18))(plVar2 + 2,pDVar3,0xffff,0,1);
  (**(code **)(*plVar4 + 0x70))(plVar4,this);
  do {
    plVar5 = (long *)(**(code **)(*plVar4 + 0x60))(plVar4);
    if (plVar5 == (long *)0x0) break;
    iVar1 = (**(code **)(*plVar5 + 0x20))(plVar5);
    if (iVar1 == 1) break;
    iVar1 = (**(code **)(*plVar5 + 0x20))(plVar5);
    if (iVar1 == 8) break;
    iVar1 = (**(code **)(*plVar5 + 0x20))(plVar5);
  } while (iVar1 != 7);
  iVar1 = (*(this->super_DOMCDATASection).super_DOMText.super_DOMCharacterData.super_DOMNode.
            _vptr_DOMNode[0xc])(this);
  if (CONCAT44(extraout_var_00,iVar1) == 0) {
    plVar5 = &XMLPlatformUtils::fgMemoryManager;
  }
  else {
    iVar1 = (*(this->super_DOMCDATASection).super_DOMText.super_DOMCharacterData.super_DOMNode.
              _vptr_DOMNode[0xc])(this);
    plVar5 = (long *)(CONCAT44(extraout_var_01,iVar1) + 0x158);
  }
  local_58.fMemoryManager = (MemoryManager *)*plVar5;
  local_58.fIndex = 0;
  local_58.fCapacity = 0x3ff;
  local_58.fFullSize = 0;
  local_58.fUsed = false;
  local_58.fFullHandler = (XMLBufferFullHandler *)0x0;
  iVar1 = (*(local_58.fMemoryManager)->_vptr_MemoryManager[3])(local_58.fMemoryManager,0x800);
  local_58.fBuffer = (XMLCh *)CONCAT44(extraout_var_02,iVar1);
  *local_58.fBuffer = L'\0';
LAB_0025df0a:
  plVar5 = (long *)(**(code **)(*plVar4 + 0x68))(plVar4);
  if (plVar5 != (long *)0x0) {
    iVar1 = (**(code **)(*plVar5 + 0x20))(plVar5);
    if (iVar1 != 1) {
      iVar1 = (**(code **)(*plVar5 + 0x20))(plVar5);
      if (iVar1 != 8) {
        iVar1 = (**(code **)(*plVar5 + 0x20))(plVar5);
        if (iVar1 != 7) {
          iVar1 = (**(code **)(*plVar5 + 0x20))(plVar5);
          if (iVar1 != 3) goto code_r0x0025df57;
          goto LAB_0025df66;
        }
      }
    }
  }
  (**(code **)(*plVar4 + 0x78))(plVar4);
  pXVar6 = (XMLCh *)(**(code **)(plVar2[-1] + 0x20))(plVar2 + -1,local_58.fIndex * 2 + 2);
  local_58.fBuffer[local_58.fIndex] = L'\0';
  XMLString::copyString(pXVar6,local_58.fBuffer);
  (*(local_58.fMemoryManager)->_vptr_MemoryManager[4])(local_58.fMemoryManager,local_58.fBuffer);
  return pXVar6;
code_r0x0025df57:
  iVar1 = (**(code **)(*plVar5 + 0x20))(plVar5);
  if (iVar1 == 4) {
LAB_0025df66:
    pXVar6 = (XMLCh *)(**(code **)(*plVar5 + 0x18))(plVar5);
    XMLBuffer::append(&local_58,pXVar6);
  }
  goto LAB_0025df0a;
}

Assistant:

const XMLCh* DOMCDATASectionImpl::getWholeText() const
{
    DOMDocument *doc = getOwnerDocument();
    if (!doc) {
        throw DOMException(DOMException::NOT_SUPPORTED_ERR, 0, GetDOMNodeMemoryManager);
        return 0;
    }
    DOMNode* root=doc->getDocumentElement();
    DOMTreeWalker* pWalker=doc->createTreeWalker(root!=NULL?root:(DOMNode*)this, DOMNodeFilter::SHOW_ALL, NULL, true);
    pWalker->setCurrentNode((DOMNode*)this);
    // Logically-adjacent text nodes are Text or CDATASection nodes that can be visited sequentially in document order or in
    // reversed document order without entering, exiting, or passing over Element, Comment, or ProcessingInstruction nodes.
	DOMNode* prevNode;
    while((prevNode=pWalker->previousNode())!=NULL)
    {
        if(prevNode->getNodeType()==ELEMENT_NODE || prevNode->getNodeType()==COMMENT_NODE || prevNode->getNodeType()==PROCESSING_INSTRUCTION_NODE)
            break;
    }
	XMLBuffer buff(1023, GetDOMNodeMemoryManager);
	DOMNode* nextNode;
    while((nextNode=pWalker->nextNode())!=NULL)
    {
        if(nextNode->getNodeType()==ELEMENT_NODE || nextNode->getNodeType()==COMMENT_NODE || nextNode->getNodeType()==PROCESSING_INSTRUCTION_NODE)
            break;
        if(nextNode->getNodeType()==TEXT_NODE || nextNode->getNodeType()==CDATA_SECTION_NODE)
    		buff.append(nextNode->getNodeValue());
    }
    pWalker->release();

	XMLCh* wholeString = (XMLCh*)((DOMDocumentImpl*)doc)->allocate((buff.getLen()+1) * sizeof(XMLCh));
	XMLString::copyString(wholeString, buff.getRawBuffer());
	return wholeString;
}